

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O1

void __thiscall QIBusPlatformInputContext::cursorRectChanged(QIBusPlatformInputContext *this)

{
  int *piVar1;
  QDebug QVar2;
  char cVar3;
  undefined4 uVar4;
  QPoint *pQVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  QDBusPendingReplyBase *this_00;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  int iVar15;
  int iVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar17;
  int iVar18;
  uint uVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  QLatin1String QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QDBusPendingReplyBase local_c0;
  QTextStream *local_b8;
  undefined1 local_b0 [8];
  QDBusPendingReplyBase local_a8;
  QDebug local_a0;
  QTextStream *local_98;
  undefined1 local_90 [8];
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  char *local_60;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(this + 0x18) + 0x2a) == '\x01') {
    QGuiApplication::inputMethod();
    uVar4 = QInputMethod::cursorRectangle();
    auVar13._0_8_ =
         (double)(((ulong)uStack_74 & 0x80000000) << 0x20 | 0x3fe0000000000000) +
         (double)CONCAT44(uStack_74,local_78);
    auVar13._8_8_ =
         (double)(((ulong)uStack_6c & 0x80000000) << 0x20 | 0x3fe0000000000000) +
         (double)CONCAT44(uStack_6c,uStack_70);
    auVar19 = minpd(_DAT_001211f0,auVar13);
    auVar19 = maxpd(auVar19,_DAT_00121200);
    iVar18 = (int)auVar19._0_8_;
    uVar21 = (uint)auVar19._8_8_;
    dVar9 = ((double)CONCAT44(uStack_74,local_78) - (double)iVar18) * 0.5 +
            (double)CONCAT44(uStack_64,local_68);
    dVar10 = ((double)CONCAT44(uStack_6c,uStack_70) - (double)(int)uVar21) * 0.5 + (double)local_60;
    auVar14._0_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    auVar14._8_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
    auVar19 = minpd(_DAT_001211f0,auVar14);
    auVar19 = maxpd(auVar19,_DAT_00121200);
    iVar11 = (int)auVar19._0_8_;
    iVar15 = (int)auVar19._8_8_;
    iVar12 = -(uint)(iVar18 + -1 + iVar11 < iVar18);
    iVar16 = -(uint)((int)((uVar21 - 1) + iVar15) < (int)uVar21);
    auVar19._4_4_ = iVar12;
    auVar19._0_4_ = iVar12;
    auVar19._8_4_ = iVar16;
    auVar19._12_4_ = iVar16;
    iVar12 = movmskpd(uVar4,auVar19);
    if (iVar12 == 0) {
      pQVar5 = (QPoint *)QGuiApplication::focusWindow();
      if (pQVar5 != (QPoint *)0x0) {
        lVar6 = QWindow::screen();
        if (lVar6 != 0) {
          QGuiApplication::platformName();
          QVar23.m_data = (char *)0x7;
          QVar23.m_size = (qsizetype)&local_78;
          cVar3 = QString::startsWith(QVar23,0x1218cd);
          piVar1 = (int *)CONCAT44(uStack_74,local_78);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
            }
          }
          if (cVar3 == '\0') {
            QWindow::screen();
            uVar7 = QScreen::geometry();
            local_78 = iVar18;
            uStack_74 = uVar21;
            uVar8 = QWindow::mapToGlobal(pQVar5);
            dVar9 = (double)QWindow::devicePixelRatio();
            iVar12 = (int)((ulong)uVar7 >> 0x20);
            dVar10 = (double)((int)uVar8 - (int)uVar7) * dVar9;
            dVar17 = (double)((int)((ulong)uVar8 >> 0x20) - iVar12) * dVar9;
            auVar20._0_8_ =
                 (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
            auVar20._8_8_ =
                 (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
            auVar19 = minpd(_DAT_001211f0,auVar20);
            auVar19 = maxpd(auVar19,_DAT_00121200);
            iVar16 = (int)auVar19._0_8_ + (int)uVar7;
            iVar12 = (int)auVar19._8_8_ + iVar12;
            local_88 = CONCAT44(iVar12,iVar16);
            auVar22._0_8_ =
                 (double)((ulong)((double)iVar11 * dVar9) & 0x8000000000000000 | 0x3fe0000000000000)
                 + (double)iVar11 * dVar9;
            auVar22._8_8_ =
                 (double)((ulong)((double)iVar15 * dVar9) & 0x8000000000000000 | 0x3fe0000000000000)
                 + (double)iVar15 * dVar9;
            auVar19 = minpd(_DAT_001211f0,auVar22);
            auVar19 = maxpd(auVar19,_DAT_00121200);
            uStack_80 = CONCAT44(iVar12 + -1 + (int)auVar19._8_8_,iVar16 + -1 + (int)auVar19._0_8_);
            lcQpaInputMethods();
            if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i
                & 1) != 0) {
              local_78 = 2;
              uStack_74 = 0;
              uStack_70 = 0;
              uStack_6c = 0;
              local_68 = 0;
              uStack_64 = 0;
              local_60 = lcQpaInputMethods::category.name;
              QMessageLogger::debug();
              QVar2.stream = local_a0.stream;
              QVar25.m_data = (storage_type *)0xa;
              QVar25.m_size = (qsizetype)&local_50;
              QString::fromUtf8(QVar25);
              QTextStream::operator<<((QTextStream *)QVar2.stream,&local_50);
              if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
              }
              local_b8 = (QTextStream *)local_a0.stream;
              *(int *)(local_a0.stream + 0x28) = *(int *)(local_a0.stream + 0x28) + 1;
              operator<<((Stream *)local_b0,(QRect *)&local_b8);
              QDebug::~QDebug((QDebug *)local_b0);
              QDebug::~QDebug((QDebug *)&local_b8);
              QDebug::~QDebug(&local_a0);
            }
            this_00 = &local_c0;
            QIBusInputContextProxy::SetCursorLocation
                      ((QDBusPendingReply<> *)this_00,
                       *(QIBusInputContextProxy **)(*(long *)(this + 0x18) + 0x10),(int)local_88,
                       local_88._4_4_,((int)uStack_80 - (int)local_88) + 1,
                       (uStack_80._4_4_ - local_88._4_4_) + 1);
          }
          else {
            uVar7 = QWindow::frameMargins();
            dVar9 = (double)QWindow::devicePixelRatio();
            iVar12 = (int)((double)((int)uVar7 + iVar18) * dVar9);
            iVar16 = (int)((double)(int)((int)((ulong)uVar7 >> 0x20) + uVar21) * dVar9);
            local_88 = CONCAT44(iVar16,iVar12);
            uStack_80 = CONCAT44(iVar16 + -1 + (int)(dVar9 * (double)iVar15),
                                 iVar12 + -1 + (int)(dVar9 * (double)iVar11));
            lcQpaInputMethods();
            if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i
                & 1) != 0) {
              local_78 = 2;
              uStack_74 = 0;
              uStack_70 = 0;
              uStack_6c = 0;
              local_68 = 0;
              uStack_64 = 0;
              local_60 = lcQpaInputMethods::category.name;
              QMessageLogger::debug();
              QVar2.stream = local_a0.stream;
              QVar24.m_data = (storage_type *)0xa;
              QVar24.m_size = (qsizetype)&local_50;
              QString::fromUtf8(QVar24);
              QTextStream::operator<<((QTextStream *)QVar2.stream,&local_50);
              if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
              }
              local_98 = (QTextStream *)local_a0.stream;
              *(int *)(local_a0.stream + 0x28) = *(int *)(local_a0.stream + 0x28) + 1;
              operator<<((Stream *)local_90,(QRect *)&local_98);
              QDebug::~QDebug((QDebug *)local_90);
              QDebug::~QDebug((QDebug *)&local_98);
              QDebug::~QDebug(&local_a0);
            }
            this_00 = &local_a8;
            QIBusInputContextProxy::SetCursorLocationRelative
                      ((QDBusPendingReply<> *)this_00,
                       *(QIBusInputContextProxy **)(*(long *)(this + 0x18) + 0x10),(int)local_88,
                       local_88._4_4_,((int)uStack_80 - (int)local_88) + 1,
                       (uStack_80._4_4_ - local_88._4_4_) + 1);
          }
          QDBusPendingReplyBase::~QDBusPendingReplyBase(this_00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIBusPlatformInputContext::cursorRectChanged()
{
    if (!d->busConnected)
        return;

    QRect r = qApp->inputMethod()->cursorRectangle().toRect();
    if (!r.isValid())
        return;

    QWindow *inputWindow = qApp->focusWindow();
    if (!inputWindow)
        return;
    if (!inputWindow->screen())
        return;

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        auto margins = inputWindow->frameMargins();
        r.translate(margins.left(), margins.top());
        qreal scale = inputWindow->devicePixelRatio();
        QRect newRect = QRect(r.x() * scale, r.y() * scale, r.width() * scale, r.height() * scale);
        qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
        d->context->SetCursorLocationRelative(newRect.x(), newRect.y(),
                                              newRect.width(), newRect.height());
        return;
    }

    // x11/xcb
    auto screenGeometry = inputWindow->screen()->geometry();
    auto point = inputWindow->mapToGlobal(r.topLeft());
    qreal scale = inputWindow->devicePixelRatio();
    auto native = (point - screenGeometry.topLeft()) * scale + screenGeometry.topLeft();
    QRect newRect(native, r.size() * scale);
    qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
    d->context->SetCursorLocation(newRect.x(), newRect.y(),
                                  newRect.width(), newRect.height());
}